

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O3

int32_t __thiscall helics::PublicationInfo::getProperty(PublicationInfo *this,int32_t option)

{
  undefined1 auVar1 [16];
  byte bVar2;
  
  if (option < 0x1c4) {
    bVar2 = 0;
    switch(option) {
    case 0x192:
      bVar2 = this->required ^ 1;
      break;
    case 0x193:
    case 0x194:
    case 0x195:
    case 0x196:
    case 0x198:
    case 0x19a:
      break;
    case 0x197:
      bVar2 = this->requiredConnections == 1;
      break;
    case 0x199:
      bVar2 = this->requiredConnections != 1;
      break;
    case 0x19b:
      bVar2 = this->buffer_data;
      break;
    default:
      bVar2 = 0;
      if (option == 0x18d) {
        bVar2 = this->required;
      }
    }
  }
  else {
    if (option == 0x22d) {
      auVar1 = SEXT816(0x431bde82d7b634db) * SEXT816((this->minTimeGap).internalTimeCode);
      return (int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f);
    }
    if (option == 0x20a) {
      return (int)((ulong)((long)(this->subscribers).
                                 super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->subscribers).
                                super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
    }
    bVar2 = 0;
    if (option == 0x1c4) {
      bVar2 = this->only_update_on_change;
    }
  }
  return (int32_t)bVar2;
}

Assistant:

int32_t PublicationInfo::getProperty(int32_t option) const
{
    bool flagval = false;
    switch (option) {
        case defs::Options::HANDLE_ONLY_TRANSMIT_ON_CHANGE:
            flagval = only_update_on_change;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            flagval = required;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            flagval = !required;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            flagval = (requiredConnections == 1);
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            flagval = requiredConnections != 1;
            break;
        case defs::Options::BUFFER_DATA:
            flagval = buffer_data;
            break;
        case defs::Options::CONNECTIONS:
            return static_cast<int32_t>(subscribers.size());
        case defs::Options::TIME_RESTRICTED:
            return static_cast<std::int32_t>(minTimeGap.to_ms().count());
        default:
            break;
    }
    return flagval ? 1 : 0;
}